

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O1

void aom_highbd_convolve8_horiz_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined2 uVar22;
  
  if (0 < h) {
    lVar12 = (long)src * 2 + -6;
    lVar9 = (long)dst * 2;
    iVar13 = 0;
    do {
      if (0 < w) {
        uVar8 = 0;
        uVar10 = (uint)((ulong)filter_x >> 4) & 0xf;
        do {
          iVar14 = 0;
          iVar15 = 0;
          iVar16 = 0;
          iVar17 = 0;
          lVar11 = 0;
          do {
            uVar1 = *(ulong *)(lVar12 + (long)((int)uVar10 >> 4) * 2 + lVar11 * 2);
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar1;
            auVar3._12_2_ = (short)(uVar1 >> 0x30);
            auVar4._8_2_ = (short)(uVar1 >> 0x20);
            auVar4._0_8_ = uVar1;
            auVar4._10_4_ = auVar3._10_4_;
            auVar6._6_8_ = 0;
            auVar6._0_6_ = auVar4._8_6_;
            auVar5._4_2_ = (short)(uVar1 >> 0x10);
            auVar5._0_4_ = (uint)uVar1;
            auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
            uVar2 = *(ulong *)((ulong)((uVar10 & 0xf) << 4) + ((ulong)filter_x & 0xffffffffffffff00)
                              + lVar11 * 2);
            uVar22 = (undefined2)(uVar2 >> 0x30);
            auVar20._8_4_ = 0;
            auVar20._0_8_ = uVar2;
            auVar20._12_2_ = uVar22;
            auVar20._14_2_ = uVar22;
            uVar22 = (undefined2)(uVar2 >> 0x20);
            auVar19._12_4_ = auVar20._12_4_;
            auVar19._8_2_ = 0;
            auVar19._0_8_ = uVar2;
            auVar19._10_2_ = uVar22;
            auVar18._10_6_ = auVar19._10_6_;
            auVar18._8_2_ = uVar22;
            auVar18._0_8_ = uVar2;
            uVar22 = (undefined2)(uVar2 >> 0x10);
            auVar7._4_8_ = auVar18._8_8_;
            auVar7._2_2_ = uVar22;
            auVar7._0_2_ = uVar22;
            auVar21._0_4_ = (int)(short)uVar2;
            auVar21._4_4_ = auVar7._0_4_ >> 0x10;
            auVar21._8_4_ = auVar18._8_4_ >> 0x10;
            auVar21._12_4_ = auVar19._12_4_ >> 0x10;
            iVar14 = iVar14 + auVar21._0_4_ * ((uint)uVar1 & 0xffff);
            iVar15 = iVar15 + auVar5._4_4_ * auVar21._4_4_;
            iVar16 = iVar16 + (int)((auVar21._8_8_ & 0xffffffff) *
                                   ((ulong)auVar4._8_6_ & 0xffffffff));
            iVar17 = iVar17 + (auVar3._10_4_ >> 0x10) * auVar21._12_4_;
            lVar11 = lVar11 + 4;
          } while (lVar11 != 8);
          iVar14 = iVar17 + iVar15 + iVar16 + iVar14 + 0x40 >> 7;
          if (bd == 10) {
            if (0x3fe < iVar14) {
              iVar14 = 0x3ff;
            }
          }
          else if (bd == 0xc) {
            if (0xffe < iVar14) {
              iVar14 = 0xfff;
            }
          }
          else if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          uVar22 = (undefined2)iVar14;
          if (iVar14 < 1) {
            uVar22 = 0;
          }
          *(undefined2 *)(lVar9 + uVar8 * 2) = uVar22;
          uVar10 = uVar10 + x_step_q4;
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)w);
      }
      lVar9 = lVar9 + dst_stride * 2;
      iVar13 = iVar13 + 1;
      lVar12 = lVar12 + src_stride * 2;
    } while (iVar13 != h);
  }
  return;
}

Assistant:

void aom_highbd_convolve8_horiz_c(const uint8_t *src, ptrdiff_t src_stride,
                                  uint8_t *dst, ptrdiff_t dst_stride,
                                  const int16_t *filter_x, int x_step_q4,
                                  const int16_t *filter_y, int y_step_q4, int w,
                                  int h, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);
  (void)filter_y;
  (void)y_step_q4;

  highbd_convolve_horiz(src, src_stride, dst, dst_stride, filters_x, x0_q4,
                        x_step_q4, w, h, bd);
}